

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tasn_dec.cc
# Opt level: O0

ulong ASN1_tag2bit(int tag)

{
  ulong uStack_10;
  int tag_local;
  
  switch(tag) {
  case 3:
    uStack_10 = 0x400;
    break;
  case 4:
    uStack_10 = 0x200;
    break;
  default:
    uStack_10 = 0;
    break;
  case 0xc:
    uStack_10 = 0x2000;
    break;
  case 0x10:
    uStack_10 = 0x10000;
    break;
  case 0x12:
    uStack_10 = 1;
    break;
  case 0x13:
    uStack_10 = 2;
    break;
  case 0x14:
    uStack_10 = 4;
    break;
  case 0x15:
    uStack_10 = 8;
    break;
  case 0x16:
    uStack_10 = 0x10;
    break;
  case 0x17:
    uStack_10 = 0x4000;
    break;
  case 0x18:
    uStack_10 = 0x8000;
    break;
  case 0x19:
    uStack_10 = 0x20;
    break;
  case 0x1a:
    uStack_10 = 0x40;
    break;
  case 0x1b:
    uStack_10 = 0x80;
    break;
  case 0x1c:
    uStack_10 = 0x100;
    break;
  case 0x1e:
    uStack_10 = 0x800;
  }
  return uStack_10;
}

Assistant:

unsigned long ASN1_tag2bit(int tag) {
  switch (tag) {
    case V_ASN1_BIT_STRING:
      return B_ASN1_BIT_STRING;
    case V_ASN1_OCTET_STRING:
      return B_ASN1_OCTET_STRING;
    case V_ASN1_UTF8STRING:
      return B_ASN1_UTF8STRING;
    case V_ASN1_SEQUENCE:
      return B_ASN1_SEQUENCE;
    case V_ASN1_NUMERICSTRING:
      return B_ASN1_NUMERICSTRING;
    case V_ASN1_PRINTABLESTRING:
      return B_ASN1_PRINTABLESTRING;
    case V_ASN1_T61STRING:
      return B_ASN1_T61STRING;
    case V_ASN1_VIDEOTEXSTRING:
      return B_ASN1_VIDEOTEXSTRING;
    case V_ASN1_IA5STRING:
      return B_ASN1_IA5STRING;
    case V_ASN1_UTCTIME:
      return B_ASN1_UTCTIME;
    case V_ASN1_GENERALIZEDTIME:
      return B_ASN1_GENERALIZEDTIME;
    case V_ASN1_GRAPHICSTRING:
      return B_ASN1_GRAPHICSTRING;
    case V_ASN1_ISO64STRING:
      return B_ASN1_ISO64STRING;
    case V_ASN1_GENERALSTRING:
      return B_ASN1_GENERALSTRING;
    case V_ASN1_UNIVERSALSTRING:
      return B_ASN1_UNIVERSALSTRING;
    case V_ASN1_BMPSTRING:
      return B_ASN1_BMPSTRING;
    default:
      return 0;
  }
}